

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetKeyboardFocusHere(int offset)

{
  ImGuiWindow_conflict **ppIVar1;
  ImGuiScrollFlags scroll_flags;
  ImGuiContext_conflict1 *pIVar2;
  
  pIVar2 = GImGui;
  if (offset < -1) {
    __assert_fail("offset >= -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x1e07,"void ImGui::SetKeyboardFocusHere(int)");
  }
  ppIVar1 = &GImGui->CurrentWindow;
  GImGui->NavWindow = *ppIVar1;
  scroll_flags = 3;
  if ((*ppIVar1)->Appearing != false) {
    scroll_flags = 0x21;
  }
  NavMoveRequestSubmit(-1,-1,0x200,scroll_flags);
  if (offset != -1) {
    pIVar2->NavTabbingInputableRemaining = offset + 1;
    return;
  }
  NavMoveRequestResolveWithLastItem();
  return;
}

Assistant:

void ImGui::SetKeyboardFocusHere(int offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(offset >= -1);    // -1 is allowed but not below
    g.NavWindow = window;
    ImGuiScrollFlags scroll_flags = window->Appearing ? ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_KeepVisibleEdgeY;
    NavMoveRequestSubmit(ImGuiDir_None, ImGuiDir_None, ImGuiNavMoveFlags_Tabbing, scroll_flags); // FIXME-NAV: Once we refactor tabbing, add LegacyApi flag to not activate non-inputable.
    if (offset == -1)
        NavMoveRequestResolveWithLastItem();
    else
        g.NavTabbingInputableRemaining = offset + 1;
}